

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_formatter.h
# Opt level: O0

char __thiscall ST::format_writer::fetch_prefix(format_writer *this)

{
  char *local_18;
  char *next;
  format_writer *this_local;
  
  for (local_18 = this->m_format_str; *local_18 != '\0'; local_18 = local_18 + 1) {
    if (*local_18 == '{') {
      if (local_18[1] != '{') break;
      (*this->_vptr_format_writer[2])
                (this,this->m_format_str,(long)local_18 - (long)this->m_format_str);
      local_18 = local_18 + 1;
      this->m_format_str = local_18;
    }
    else if ((*local_18 == '}') && (local_18[1] == '}')) {
      (*this->_vptr_format_writer[2])
                (this,this->m_format_str,(long)local_18 - (long)this->m_format_str);
      local_18 = local_18 + 1;
      this->m_format_str = local_18;
    }
  }
  if (local_18 != this->m_format_str) {
    (*this->_vptr_format_writer[2])
              (this,this->m_format_str,(long)local_18 - (long)this->m_format_str);
  }
  this->m_format_str = local_18;
  return *this->m_format_str;
}

Assistant:

ST_NODISCARD
        char fetch_prefix()
        {
            const char *next = m_format_str;
            while (*next) {
                if (*next == '{') {
                    if (*(next + 1) != '{')
                        break;

                    append(m_format_str, next - m_format_str);
                    m_format_str = ++next;
                } else if (*next == '}') {
                    if (*(next + 1) == '}') {
                        append(m_format_str, next - m_format_str);
                        m_format_str = ++next;
                    }
                }
                ++next;
            }
            if (next != m_format_str)
                append(m_format_str, next - m_format_str);
            m_format_str = next;

            return *m_format_str;
        }